

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

void __thiscall
vkt::compute::anon_unknown_0::WriteToMultipleSSBOTest::initPrograms
          (WriteToMultipleSSBOTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  ostringstream src;
  long *local_358;
  long local_350;
  long local_348 [2];
  string local_338;
  uint local_318 [2];
  value_type local_310 [3];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout (local_size_x = ",0x17);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a0,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_y = ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_z = ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"layout(binding = 0) writeonly buffer Out0 {\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    uint values[",0x10);
  if (this->m_sized == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    std::ostream::_M_insert<unsigned_long>((ulong)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
  }
  else {
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_338._M_dataplus._M_p,local_338._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} sb_out0;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"layout(binding = 1) writeonly buffer Out1 {\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    uint values[",0x10);
  if (this->m_sized == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    std::ostream::_M_insert<unsigned_long>((ulong)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
  }
  else {
    local_358 = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"");
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_358,local_350);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} sb_out1;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
             ,0x78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"        uint offset          = numValuesPerInv*groupNdx;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"            sb_out0.values[offset + ndx] = offset + ndx;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"        uint offset          = numValuesPerInv*groupNdx;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  paVar1 = &local_338.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"comp","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_338);
  std::__cxx11::stringbuf::str();
  local_318[0] = 5;
  local_310[0]._M_dataplus._M_p = (pointer)&local_310[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_310,local_358,(long)local_358 + local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_318[0],local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310[0]._M_dataplus._M_p != &local_310[0].field_2) {
    operator_delete(local_310[0]._M_dataplus._M_p,local_310[0].field_2._M_allocated_capacity + 1);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void WriteToMultipleSSBOTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) writeonly buffer Out0 {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_out0;\n"
		<< "layout(binding = 1) writeonly buffer Out1 {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_out1;\n"
		<< "void main (void) {\n"
		<< "    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
		<< "\n"
		<< "    {\n"
		<< "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
		<< "        uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "            sb_out0.values[offset + ndx] = offset + ndx;\n"
		<< "    }\n"
		<< "    {\n"
		<< "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
		<< "        uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
		<< "    }\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}